

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QDBusIntrospection::Interface>::~QSharedDataPointer
          (QSharedDataPointer<QDBusIntrospection::Interface> *this)

{
  Interface *pIVar1;
  Data *pDVar2;
  
  pIVar1 = (this->d).ptr;
  if (pIVar1 != (Interface *)0x0) {
    LOCK();
    (pIVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pIVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pIVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pIVar1 = (this->d).ptr;
      if (pIVar1 != (Interface *)0x0) {
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QDBusIntrospection::Property,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Property>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&(pIVar1->properties).d);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::multimap<QString,_QDBusIntrospection::Signal,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Signal>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&(pIVar1->signals_).d);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::multimap<QString,_QDBusIntrospection::Method,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Method>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&(pIVar1->methods).d);
        QtPrivate::
        QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QDBusIntrospection::Annotation,_std::less<QString>,_std::allocator<std::pair<const_QString,_QDBusIntrospection::Annotation>_>_>_>_>
        ::~QExplicitlySharedDataPointerV2(&(pIVar1->annotations).d);
        pDVar2 = (pIVar1->introspection).d.d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate(&((pIVar1->introspection).d.d)->super_QArrayData,2,0x10);
          }
        }
        pDVar2 = (pIVar1->name).d.d;
        if (pDVar2 != (Data *)0x0) {
          LOCK();
          (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
          UNLOCK();
          if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
            QArrayData::deallocate(&((pIVar1->name).d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      operator_delete(pIVar1,0x68);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }